

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

BaseNode * __thiscall
asmjit::v1_14::BaseBuilder::addBefore(BaseBuilder *this,BaseNode *node,BaseNode *ref)

{
  long lVar1;
  NodeList *pNVar2;
  
  if (*(long *)node != 0) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/builder.cpp"
               ,0xd1,"!node->_prev");
  }
  if (*(long *)(node + 8) != 0) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/builder.cpp"
               ,0xd2,"!node->_next");
  }
  if ((char)node[0x11] < '\0') {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/builder.cpp"
               ,0xd3,"!node->isActive()");
  }
  if ((char)ref[0x11] < '\0') {
    lVar1 = *(long *)ref;
    *(long *)node = lVar1;
    *(BaseNode **)(node + 8) = ref;
    node[0x11] = (BaseNode)((byte)node[0x11] | 0x80);
    if (node[0x10] == (BaseNode)0x2) {
      this->_dirtySectionLinks = true;
    }
    *(BaseNode **)ref = node;
    pNVar2 = (NodeList *)(lVar1 + 8);
    if (lVar1 == 0) {
      pNVar2 = &this->_nodeList;
    }
    *(BaseNode **)pNVar2 = node;
    return node;
  }
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/builder.cpp"
             ,0xd4,"ref->isActive()");
}

Assistant:

BaseNode* BaseBuilder::addBefore(BaseNode* node, BaseNode* ref) noexcept {
  ASMJIT_ASSERT(!node->_prev);
  ASMJIT_ASSERT(!node->_next);
  ASMJIT_ASSERT(!node->isActive());
  ASMJIT_ASSERT(ref->isActive());

  BaseNode* prev = ref->prev();
  BaseNode* next = ref;

  node->_prev = prev;
  node->_next = next;

  node->addFlags(NodeFlags::kIsActive);
  if (node->isSection())
    _dirtySectionLinks = true;

  next->_prev = node;
  if (prev)
    prev->_next = node;
  else
    _nodeList._first = node;

  return node;
}